

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O0

bool __thiscall
OpenMesh::IO::_OMReader_::read_binary_vertex_chunk
          (_OMReader_ *this,istream *_is,BaseImporter *_bi,Options *_opt,bool _swap)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  BaseProperty *_bp;
  mostream *pmVar3;
  size_t sVar4;
  bool bVar5;
  byte local_121;
  byte local_fd;
  byte local_d5;
  byte local_b5;
  size_t size_of;
  BaseHandle local_88;
  BaseHandle local_84;
  int local_80;
  ulong local_70;
  size_t vidx;
  PropertyName custom_prop;
  Vec3uc v3uc;
  Vec2f v2f;
  Vec3f v3f;
  bool _swap_local;
  Options *_opt_local;
  BaseImporter *_bi_local;
  istream *_is_local;
  _OMReader_ *this_local;
  
  if (((uint)this->chunk_header_ >> 2 & 7) != 0) {
    __assert_fail("chunk_header_.entity_ == Chunk::Entity_Vertex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                  ,0x119,
                  "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                 );
  }
  VectorT<float,_3>::VectorT((VectorT<float,_3> *)&v2f);
  VectorT<float,_2>::VectorT((VectorT<float,_2> *)&stack0xffffffffffffffc0);
  VectorT<unsigned_char,_3>::VectorT((VectorT<unsigned_char,_3> *)&custom_prop.field_0x1d);
  OMFormat::Chunk::PropertyName::PropertyName((PropertyName *)&vidx);
  local_70 = 0;
  switch((uint)this->chunk_header_ >> 5 & 0xf) {
  case 0:
    sVar4 = OMFormat::dimensions(&this->chunk_header_);
    iVar2 = VectorT<float,_3>::dim();
    if (sVar4 != (long)iVar2) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x124,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    while( true ) {
      local_b5 = 0;
      if (local_70 < (this->header_).n_vertices_) {
        local_b5 = std::ios::eof();
        local_b5 = local_b5 ^ 0xff;
      }
      if ((local_b5 & 1) == 0) break;
      sVar4 = vector_restore<OpenMesh::VectorT<float,3>>(_is,(VectorT<float,_3> *)&v2f,_swap);
      this->bytes_ = this->bytes_ + sVar4;
      local_80 = (*_bi->_vptr_BaseImporter[2])(_bi,&v2f);
      local_70 = local_70 + 1;
    }
    break;
  case 1:
    sVar4 = OMFormat::dimensions(&this->chunk_header_);
    iVar2 = VectorT<float,_3>::dim();
    if (sVar4 != (long)iVar2) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x12d,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    Options::operator+=(&this->fileOptions_,0x10);
    while( true ) {
      local_d5 = 0;
      if (local_70 < (this->header_).n_vertices_) {
        local_d5 = std::ios::eof();
        local_d5 = local_d5 ^ 0xff;
      }
      if ((local_d5 & 1) == 0) break;
      sVar4 = vector_restore<OpenMesh::VectorT<float,3>>(_is,(VectorT<float,_3> *)&v2f,_swap);
      this->bytes_ = this->bytes_ + sVar4;
      bVar5 = Options::vertex_has_normal(&this->fileOptions_);
      if ((bVar5) && (bVar5 = Options::vertex_has_normal(_opt), bVar5)) {
        VertexHandle::VertexHandle((VertexHandle *)&local_84,(int)local_70);
        (*_bi->_vptr_BaseImporter[8])(_bi,(ulong)(uint)local_84.idx_,&v2f);
      }
      local_70 = local_70 + 1;
    }
    break;
  case 2:
    sVar4 = OMFormat::dimensions(&this->chunk_header_);
    iVar2 = VectorT<float,_2>::dim();
    if (sVar4 != (long)iVar2) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec2f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x138,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    Options::operator+=(&this->fileOptions_,0x40);
    while( true ) {
      local_fd = 0;
      if (local_70 < (this->header_).n_vertices_) {
        local_fd = std::ios::eof();
        local_fd = local_fd ^ 0xff;
      }
      if ((local_fd & 1) == 0) break;
      sVar4 = vector_restore<OpenMesh::VectorT<float,2>>
                        (_is,(VectorT<float,_2> *)&stack0xffffffffffffffc0,_swap);
      this->bytes_ = this->bytes_ + sVar4;
      bVar5 = Options::vertex_has_texcoord(&this->fileOptions_);
      if ((bVar5) && (bVar5 = Options::vertex_has_texcoord(_opt), bVar5)) {
        VertexHandle::VertexHandle((VertexHandle *)&local_88,(int)local_70);
        (*_bi->_vptr_BaseImporter[0xd])(_bi,(ulong)(uint)local_88.idx_,&stack0xffffffffffffffc0);
      }
      local_70 = local_70 + 1;
    }
    break;
  default:
    pmVar3 = omerr();
    std::operator<<(&pmVar3->super_ostream,"Unknown chunk type ignored!\n");
    uVar1 = (this->header_).n_vertices_;
    sVar4 = OMFormat::vector_size(&this->chunk_header_);
    std::istream::ignore((long)_is);
    this->bytes_ = uVar1 * sVar4 + this->bytes_;
    break;
  case 4:
    sVar4 = OMFormat::dimensions(&this->chunk_header_);
    if (sVar4 != 3) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x144,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    Options::operator+=(&this->fileOptions_,0x20);
    while( true ) {
      local_121 = 0;
      if (local_70 < (this->header_).n_vertices_) {
        local_121 = std::ios::eof();
        local_121 = local_121 ^ 0xff;
      }
      if ((local_121 & 1) == 0) break;
      sVar4 = vector_restore<OpenMesh::VectorT<unsigned_char,3>>
                        (_is,(VectorT<unsigned_char,_3> *)&custom_prop.field_0x1d,_swap);
      this->bytes_ = this->bytes_ + sVar4;
      bVar5 = Options::vertex_has_color(&this->fileOptions_);
      if ((bVar5) && (bVar5 = Options::vertex_has_color(_opt), bVar5)) {
        VertexHandle::VertexHandle((VertexHandle *)((long)&size_of + 4),(int)local_70);
        (*_bi->_vptr_BaseImporter[9])(_bi,(ulong)size_of._4_4_,&custom_prop.field_0x1d);
      }
      local_70 = local_70 + 1;
    }
    break;
  case 6:
    iVar2 = (*_bi->_vptr_BaseImporter[0x19])();
    _bp = BaseKernel::_get_vprop
                    ((BaseKernel *)CONCAT44(extraout_var,iVar2),&(this->property_name_).super_string
                    );
    sVar4 = restore_binary_custom_data(this,_is,_bp,(ulong)(this->header_).n_vertices_,_swap);
    this->bytes_ = sVar4 + this->bytes_;
    local_70 = (ulong)(this->header_).n_vertices_;
  }
  bVar5 = local_70 == (this->header_).n_vertices_;
  OMFormat::Chunk::PropertyName::~PropertyName((PropertyName *)&vidx);
  return bVar5;
}

Assistant:

bool _OMReader_::read_binary_vertex_chunk(std::istream &_is, BaseImporter &_bi, Options &_opt, bool _swap) const
{
  using OMFormat::Chunk;

  assert( chunk_header_.entity_ == Chunk::Entity_Vertex);

  OpenMesh::Vec3f v3f;
  OpenMesh::Vec2f v2f;
  OpenMesh::Vec3uc v3uc; // rgb

  OMFormat::Chunk::PropertyName custom_prop;

  size_t vidx = 0;
  switch (chunk_header_.type_) {
    case Chunk::Type_Pos:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim()));

      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3f, _swap);
        _bi.add_vertex(v3f);
      }
      break;

    case Chunk::Type_Normal:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim()));

      fileOptions_ += Options::VertexNormal;
      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3f, _swap);
        if (fileOptions_.vertex_has_normal() && _opt.vertex_has_normal())
          _bi.set_normal(VertexHandle(int(vidx)), v3f);
      }
      break;

    case Chunk::Type_Texcoord:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec2f::dim()));

      fileOptions_ += Options::VertexTexCoord;
      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v2f, _swap);
        if (fileOptions_.vertex_has_texcoord() && _opt.vertex_has_texcoord())
          _bi.set_texcoord(VertexHandle(int(vidx)), v2f);
      }
      break;

    case Chunk::Type_Color:

      assert( OMFormat::dimensions(chunk_header_) == 3);

      fileOptions_ += Options::VertexColor;

      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3uc, _swap);
        if (fileOptions_.vertex_has_color() && _opt.vertex_has_color())
          _bi.set_color(VertexHandle(int(vidx)), v3uc);
      }
      break;

    case Chunk::Type_Custom:

      bytes_ += restore_binary_custom_data(_is, _bi.kernel()->_get_vprop(property_name_), header_.n_vertices_, _swap);

      vidx = header_.n_vertices_;

      break;

    default: // skip unknown chunks
    {
      omerr() << "Unknown chunk type ignored!\n";
      size_t size_of = header_.n_vertices_ * OMFormat::vector_size(chunk_header_);
      _is.ignore(size_of);
      bytes_ += size_of;
    }
  }

  // all chunk data has been read..?!
  return vidx == header_.n_vertices_;
}